

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void ResetLineAfterWrap(TidyPrintImpl *pprint)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uint *puVar5;
  int wrap;
  uint uVar6;
  ulong uVar7;
  uint *puVar8;
  uint uVar4;
  
  uVar4 = pprint->linelen;
  uVar6 = pprint->wraphere;
  uVar7 = (ulong)uVar6;
  uVar3 = 0;
  if (uVar6 < uVar4) {
    puVar5 = pprint->linebuf;
    puVar8 = puVar5 + uVar7;
    puVar1 = puVar5 + uVar4;
    iVar2 = pprint->indent[0].attrValStart;
    if ((iVar2 != 0) && (iVar2 < 1 || (int)uVar6 <= iVar2)) {
      do {
        uVar6 = (uint)uVar7;
        if (*puVar8 != 0x20) break;
        puVar8 = puVar8 + 1;
        uVar6 = uVar6 + 1;
        uVar7 = (ulong)uVar6;
        pprint->wraphere = uVar6;
      } while (puVar8 < puVar1);
    }
    if (puVar8 < puVar1) {
      do {
        uVar3 = *puVar8;
        puVar8 = puVar8 + 1;
        *puVar5 = uVar3;
        puVar5 = puVar5 + 1;
      } while (puVar8 < puVar1);
      uVar4 = pprint->linelen;
      uVar6 = pprint->wraphere;
    }
    uVar3 = uVar4 - uVar6;
  }
  pprint->linelen = uVar3;
  ResetLine(pprint);
  return;
}

Assistant:

static void ResetLineAfterWrap( TidyPrintImpl* pprint )
{
    if ( pprint->linelen > pprint->wraphere )
    {
        uint *p = pprint->linebuf;
        uint *q = p + pprint->wraphere;
        uint *end = p + pprint->linelen;

        if ( ! IsWrapInAttrVal(pprint) )
        {
            while ( q < end && *q == ' ' )
                ++q, ++pprint->wraphere;
        }

        while ( q < end )
            *p++ = *q++;

        pprint->linelen -= pprint->wraphere;
    }
    else
    {
        pprint->linelen = 0;
    }

    ResetLine( pprint );
}